

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::AddSchemaRefs(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                *this,SchemaType *schema)

{
  bool bVar1;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  **ppGVar2;
  SchemaEntry *this_00;
  SchemaEntry *entry;
  SchemaRefPtr *ref;
  SchemaType *schema_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  while( true ) {
    bVar1 = internal::Stack<rapidjson::CrtAllocator>::Empty(&this->schemaRef_);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppGVar2 = internal::Stack<rapidjson::CrtAllocator>::
              Pop<rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>const*>
                        (&this->schemaRef_,1);
    this_00 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::SchemaEntry>
                        (&this->schemaMap_,1);
    SchemaEntry::SchemaEntry(this_00,*ppGVar2,schema,false,this->allocator_);
  }
  return;
}

Assistant:

void AddSchemaRefs(SchemaType* schema) {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaDocument::AddSchemaRefs");
        while (!schemaRef_.Empty()) {
            SchemaRefPtr *ref = schemaRef_.template Pop<SchemaRefPtr>(1);
            SchemaEntry *entry = schemaMap_.template Push<SchemaEntry>();
            new (entry) SchemaEntry(**ref, schema, false, allocator_);
        }
    }